

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O3

int __thiscall QListModel::remove(QListModel *this,char *__filename)

{
  long lVar1;
  long lVar2;
  QListWidgetItem *pQVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (__filename != (char *)0x0) {
    lVar2 = (this->items).d.size;
    iVar6 = -1;
    if (lVar2 != 0) {
      lVar5 = -8;
      do {
        if (lVar2 * -8 + lVar5 == -8) goto LAB_0057a00e;
        lVar1 = lVar5 + 8;
        lVar4 = lVar5 + 8;
        lVar5 = lVar1;
      } while (*(char **)((long)(this->items).d.ptr + lVar4) != __filename);
      iVar6 = (int)(lVar1 >> 3);
    }
LAB_0057a00e:
    local_38 = 0xffffffffffffffff;
    local_30 = 0;
    uStack_28 = 0;
    QAbstractItemModel::beginRemoveRows((QModelIndex *)this,(int)&local_38,iVar6);
    pQVar3 = (this->items).d.ptr[iVar6];
    pQVar3->d->theid = -1;
    pQVar3->view = (QListWidget *)0x0;
    QList<QListWidgetItem_*>::removeAt(&this->items,(long)iVar6);
    QAbstractItemModel::endRemoveRows();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QListModel::remove(QListWidgetItem *item)
{
    if (!item)
        return;
    int row = items.indexOf(item); // ### use index(item) - it's faster
    Q_ASSERT(row != -1);
    beginRemoveRows(QModelIndex(), row, row);
    items.at(row)->d->theid = -1;
    items.at(row)->view = nullptr;
    items.removeAt(row);
    endRemoveRows();
}